

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

Value * __thiscall
kj::_::NullableValue<kj::_::Debug::Context::Value>::emplace<kj::_::Debug::Context::Value>
          (NullableValue<kj::_::Debug::Context::Value> *this,Value *params)

{
  Value *params_00;
  Value *params_local;
  NullableValue<kj::_::Debug::Context::Value> *this_local;
  
  if ((this->isSet & 1U) != 0) {
    this->isSet = false;
    dtor<kj::_::Debug::Context::Value>(&(this->field_1).value);
  }
  params_00 = fwd<kj::_::Debug::Context::Value>(params);
  ctor<kj::_::Debug::Context::Value,kj::_::Debug::Context::Value>(&(this->field_1).value,params_00);
  this->isSet = true;
  return (Value *)&this->field_1;
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }